

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O0

bool __thiscall cmCTestBZR::InfoParser::ProcessLine(InfoParser *this)

{
  bool bVar1;
  string local_50;
  string local_30;
  InfoParser *local_10;
  InfoParser *this_local;
  
  local_10 = this;
  bVar1 = cmsys::RegularExpression::find(&this->RegexCheckOut,&(this->super_LineParser).Line);
  if (bVar1) {
    cmsys::RegularExpression::match_abi_cxx11_(&local_30,&this->RegexCheckOut,1);
    std::__cxx11::string::operator=((string *)&this->BZR->URL,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    this->CheckOutFound = true;
  }
  else if (((this->CheckOutFound & 1U) == 0) &&
          (bVar1 = cmsys::RegularExpression::find(&this->RegexParent,&(this->super_LineParser).Line)
          , bVar1)) {
    cmsys::RegularExpression::match_abi_cxx11_(&local_50,&this->RegexParent,1);
    std::__cxx11::string::operator=((string *)&this->BZR->URL,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return true;
}

Assistant:

virtual bool ProcessLine()
    {
    if(this->RegexCheckOut.find(this->Line))
      {
      this->BZR->URL = this->RegexCheckOut.match(1);
      CheckOutFound = true;
      }
    else if(!CheckOutFound && this->RegexParent.find(this->Line))
      {
      this->BZR->URL = this->RegexParent.match(1);
      }
    return true;
    }